

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doubling-factor-table.cpp
# Opt level: O0

void __thiscall
mahjong::DoublingFactorTable::DoublingFactorTable
          (DoublingFactorTable *this,PlayerHand *hand,WiningState *state)

{
  bool bVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_mahjong::Pattern,_int>_>,_bool> pVar2;
  Pattern local_624;
  pair<const_mahjong::Pattern,_int> local_620;
  _Base_ptr local_618;
  undefined1 local_610;
  Pattern local_604;
  pair<const_mahjong::Pattern,_int> local_600;
  _Base_ptr local_5f8;
  undefined1 local_5f0;
  Pattern local_5e4;
  pair<const_mahjong::Pattern,_int> local_5e0;
  _Base_ptr local_5d8;
  undefined1 local_5d0;
  Pattern local_5c4;
  pair<const_mahjong::Pattern,_int> local_5c0;
  _Base_ptr local_5b8;
  undefined1 local_5b0;
  Pattern local_5a4;
  pair<const_mahjong::Pattern,_int> local_5a0;
  _Base_ptr local_598;
  undefined1 local_590;
  Pattern local_584;
  pair<const_mahjong::Pattern,_int> local_580;
  _Base_ptr local_578;
  undefined1 local_570;
  Pattern local_564;
  pair<const_mahjong::Pattern,_int> local_560;
  _Base_ptr local_558;
  undefined1 local_550;
  Pattern local_544;
  pair<const_mahjong::Pattern,_int> local_540;
  _Base_ptr local_538;
  undefined1 local_530;
  Pattern local_524;
  pair<const_mahjong::Pattern,_int> local_520;
  _Base_ptr local_518;
  undefined1 local_510;
  Pattern local_504;
  pair<const_mahjong::Pattern,_int> local_500;
  _Base_ptr local_4f8;
  undefined1 local_4f0;
  Pattern local_4e4;
  pair<const_mahjong::Pattern,_int> local_4e0;
  _Base_ptr local_4d8;
  undefined1 local_4d0;
  Pattern local_4c4;
  pair<const_mahjong::Pattern,_int> local_4c0;
  _Base_ptr local_4b8;
  undefined1 local_4b0;
  int local_4a8 [2];
  pair<const_mahjong::Pattern,_int> local_4a0;
  _Base_ptr local_498;
  undefined1 local_490;
  int local_488 [2];
  pair<const_mahjong::Pattern,_int> local_480;
  _Base_ptr local_478;
  undefined1 local_470;
  int local_468 [2];
  pair<const_mahjong::Pattern,_int> local_460;
  _Base_ptr local_458;
  undefined1 local_450;
  int local_448 [2];
  pair<const_mahjong::Pattern,_int> local_440;
  _Base_ptr local_438;
  undefined1 local_430;
  int local_428 [2];
  pair<const_mahjong::Pattern,_int> local_420;
  _Base_ptr local_418;
  undefined1 local_410;
  int local_408 [2];
  pair<const_mahjong::Pattern,_int> local_400;
  _Base_ptr local_3f8;
  undefined1 local_3f0;
  int local_3e8 [2];
  pair<const_mahjong::Pattern,_int> local_3e0;
  _Base_ptr local_3d8;
  undefined1 local_3d0;
  int local_3c8 [2];
  pair<const_mahjong::Pattern,_int> local_3c0;
  _Base_ptr local_3b8;
  undefined1 local_3b0;
  int local_3a8 [2];
  pair<const_mahjong::Pattern,_int> local_3a0;
  _Base_ptr local_398;
  undefined1 local_390;
  int local_388 [2];
  pair<const_mahjong::Pattern,_int> local_380;
  _Base_ptr local_378;
  undefined1 local_370;
  int local_368 [2];
  pair<const_mahjong::Pattern,_int> local_360;
  _Base_ptr local_358;
  undefined1 local_350;
  int local_348 [2];
  pair<const_mahjong::Pattern,_int> local_340;
  _Base_ptr local_338;
  undefined1 local_330;
  int local_328 [2];
  pair<const_mahjong::Pattern,_int> local_320;
  _Base_ptr local_318;
  undefined1 local_310;
  int local_308 [2];
  pair<const_mahjong::Pattern,_int> local_300;
  _Base_ptr local_2f8;
  undefined1 local_2f0;
  int local_2e8 [2];
  pair<const_mahjong::Pattern,_int> local_2e0;
  _Base_ptr local_2d8;
  undefined1 local_2d0;
  int local_2c8 [2];
  pair<const_mahjong::Pattern,_int> local_2c0;
  _Base_ptr local_2b8;
  undefined1 local_2b0;
  int local_2a8 [2];
  pair<const_mahjong::Pattern,_int> local_2a0;
  _Base_ptr local_298;
  undefined1 local_290;
  int local_288 [2];
  pair<const_mahjong::Pattern,_int> local_280;
  _Base_ptr local_278;
  undefined1 local_270;
  int local_268 [2];
  pair<const_mahjong::Pattern,_int> local_260;
  _Base_ptr local_258;
  undefined1 local_250;
  int local_248 [2];
  pair<const_mahjong::Pattern,_int> local_240;
  _Base_ptr local_238;
  undefined1 local_230;
  int local_228 [2];
  pair<const_mahjong::Pattern,_int> local_220;
  _Base_ptr local_218;
  undefined1 local_210;
  int local_208 [2];
  pair<const_mahjong::Pattern,_int> local_200;
  _Base_ptr local_1f8;
  undefined1 local_1f0;
  int local_1e8 [2];
  pair<const_mahjong::Pattern,_int> local_1e0;
  _Base_ptr local_1d8;
  undefined1 local_1d0;
  int local_1c8 [2];
  pair<const_mahjong::Pattern,_int> local_1c0;
  _Base_ptr local_1b8;
  undefined1 local_1b0;
  int local_1a8 [2];
  pair<const_mahjong::Pattern,_int> local_1a0;
  _Base_ptr local_198;
  undefined1 local_190;
  int local_188 [2];
  pair<const_mahjong::Pattern,_int> local_180;
  _Base_ptr local_178;
  undefined1 local_170;
  int local_168 [2];
  pair<const_mahjong::Pattern,_int> local_160;
  _Base_ptr local_158;
  undefined1 local_150;
  int local_148 [2];
  pair<const_mahjong::Pattern,_int> local_140;
  _Base_ptr local_138;
  undefined1 local_130;
  int local_128 [2];
  pair<const_mahjong::Pattern,_int> local_120;
  _Base_ptr local_118;
  undefined1 local_110;
  int local_108 [2];
  pair<const_mahjong::Pattern,_int> local_100;
  _Base_ptr local_f8;
  undefined1 local_f0;
  int local_e8 [2];
  pair<const_mahjong::Pattern,_int> local_e0;
  _Base_ptr local_d8;
  undefined1 local_d0;
  int local_c8 [2];
  pair<const_mahjong::Pattern,_int> local_c0;
  _Base_ptr local_b8;
  undefined1 local_b0;
  int local_a8 [2];
  pair<const_mahjong::Pattern,_int> local_a0;
  _Base_ptr local_98;
  undefined1 local_90;
  int local_88 [2];
  pair<const_mahjong::Pattern,_int> local_80;
  _Base_ptr local_78;
  undefined1 local_70;
  int local_68 [2];
  pair<const_mahjong::Pattern,_int> local_60;
  _Base_ptr local_58;
  undefined1 local_50;
  int local_44 [2];
  pair<const_mahjong::Pattern,_int> local_3c [3];
  int local_24;
  WiningState *pWStack_20;
  int closed_hand_bonus;
  WiningState *state_local;
  PlayerHand *hand_local;
  DoublingFactorTable *this_local;
  
  this->hand = hand;
  this->state = state;
  pWStack_20 = state;
  state_local = (WiningState *)hand;
  hand_local = (PlayerHand *)this;
  std::
  map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
  ::map(&this->factor_table);
  local_24 = 0;
  bVar1 = PlayerHand::isClosedHand((PlayerHand *)state_local);
  if (bVar1) {
    local_24 = 1;
  }
  local_44[1] = 1;
  local_44[0] = 1;
  std::pair<const_mahjong::Pattern,_int>::pair<mahjong::Pattern,_int,_true>
            (local_3c,(Pattern *)(local_44 + 1),local_44);
  pVar2 = std::
          map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
          ::insert(&this->factor_table,local_3c);
  local_58 = (_Base_ptr)pVar2.first._M_node;
  local_50 = pVar2.second;
  local_68[1] = 3;
  local_68[0] = 1;
  std::pair<const_mahjong::Pattern,_int>::pair<mahjong::Pattern,_int,_true>
            (&local_60,(Pattern *)(local_68 + 1),local_68);
  pVar2 = std::
          map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
          ::insert(&this->factor_table,&local_60);
  local_78 = (_Base_ptr)pVar2.first._M_node;
  local_70 = pVar2.second;
  local_88[1] = 4;
  local_88[0] = 1;
  std::pair<const_mahjong::Pattern,_int>::pair<mahjong::Pattern,_int,_true>
            (&local_80,(Pattern *)(local_88 + 1),local_88);
  pVar2 = std::
          map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
          ::insert(&this->factor_table,&local_80);
  local_98 = (_Base_ptr)pVar2.first._M_node;
  local_90 = pVar2.second;
  local_a8[1] = 5;
  local_a8[0] = 1;
  std::pair<const_mahjong::Pattern,_int>::pair<mahjong::Pattern,_int,_true>
            (&local_a0,(Pattern *)(local_a8 + 1),local_a8);
  pVar2 = std::
          map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
          ::insert(&this->factor_table,&local_a0);
  local_b8 = (_Base_ptr)pVar2.first._M_node;
  local_b0 = pVar2.second;
  local_c8[1] = 6;
  local_c8[0] = 1;
  std::pair<const_mahjong::Pattern,_int>::pair<mahjong::Pattern,_int,_true>
            (&local_c0,(Pattern *)(local_c8 + 1),local_c8);
  pVar2 = std::
          map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
          ::insert(&this->factor_table,&local_c0);
  local_d8 = (_Base_ptr)pVar2.first._M_node;
  local_d0 = pVar2.second;
  local_e8[1] = 7;
  local_e8[0] = 1;
  std::pair<const_mahjong::Pattern,_int>::pair<mahjong::Pattern,_int,_true>
            (&local_e0,(Pattern *)(local_e8 + 1),local_e8);
  pVar2 = std::
          map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
          ::insert(&this->factor_table,&local_e0);
  local_f8 = (_Base_ptr)pVar2.first._M_node;
  local_f0 = pVar2.second;
  local_108[1] = 8;
  local_108[0] = 1;
  std::pair<const_mahjong::Pattern,_int>::pair<mahjong::Pattern,_int,_true>
            (&local_100,(Pattern *)(local_108 + 1),local_108);
  pVar2 = std::
          map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
          ::insert(&this->factor_table,&local_100);
  local_118 = (_Base_ptr)pVar2.first._M_node;
  local_110 = pVar2.second;
  local_128[1] = 9;
  local_128[0] = 1;
  std::pair<const_mahjong::Pattern,_int>::pair<mahjong::Pattern,_int,_true>
            (&local_120,(Pattern *)(local_128 + 1),local_128);
  pVar2 = std::
          map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
          ::insert(&this->factor_table,&local_120);
  local_138 = (_Base_ptr)pVar2.first._M_node;
  local_130 = pVar2.second;
  local_148[1] = 10;
  local_148[0] = 1;
  std::pair<const_mahjong::Pattern,_int>::pair<mahjong::Pattern,_int,_true>
            (&local_140,(Pattern *)(local_148 + 1),local_148);
  pVar2 = std::
          map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
          ::insert(&this->factor_table,&local_140);
  local_158 = (_Base_ptr)pVar2.first._M_node;
  local_150 = pVar2.second;
  local_168[1] = 0xb;
  local_168[0] = 1;
  std::pair<const_mahjong::Pattern,_int>::pair<mahjong::Pattern,_int,_true>
            (&local_160,(Pattern *)(local_168 + 1),local_168);
  pVar2 = std::
          map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
          ::insert(&this->factor_table,&local_160);
  local_178 = (_Base_ptr)pVar2.first._M_node;
  local_170 = pVar2.second;
  local_188[1] = 0xc;
  local_188[0] = 1;
  std::pair<const_mahjong::Pattern,_int>::pair<mahjong::Pattern,_int,_true>
            (&local_180,(Pattern *)(local_188 + 1),local_188);
  pVar2 = std::
          map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
          ::insert(&this->factor_table,&local_180);
  local_198 = (_Base_ptr)pVar2.first._M_node;
  local_190 = pVar2.second;
  local_1a8[1] = 0xd;
  local_1a8[0] = 1;
  std::pair<const_mahjong::Pattern,_int>::pair<mahjong::Pattern,_int,_true>
            (&local_1a0,(Pattern *)(local_1a8 + 1),local_1a8);
  pVar2 = std::
          map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
          ::insert(&this->factor_table,&local_1a0);
  local_1b8 = (_Base_ptr)pVar2.first._M_node;
  local_1b0 = pVar2.second;
  local_1c8[1] = 0xe;
  local_1c8[0] = 1;
  std::pair<const_mahjong::Pattern,_int>::pair<mahjong::Pattern,_int,_true>
            (&local_1c0,(Pattern *)(local_1c8 + 1),local_1c8);
  pVar2 = std::
          map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
          ::insert(&this->factor_table,&local_1c0);
  local_1d8 = (_Base_ptr)pVar2.first._M_node;
  local_1d0 = pVar2.second;
  local_1e8[1] = 0xf;
  local_1e8[0] = 1;
  std::pair<const_mahjong::Pattern,_int>::pair<mahjong::Pattern,_int,_true>
            (&local_1e0,(Pattern *)(local_1e8 + 1),local_1e8);
  pVar2 = std::
          map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
          ::insert(&this->factor_table,&local_1e0);
  local_1f8 = (_Base_ptr)pVar2.first._M_node;
  local_1f0 = pVar2.second;
  local_208[1] = 0x10;
  local_208[0] = 1;
  std::pair<const_mahjong::Pattern,_int>::pair<mahjong::Pattern,_int,_true>
            (&local_200,(Pattern *)(local_208 + 1),local_208);
  pVar2 = std::
          map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
          ::insert(&this->factor_table,&local_200);
  local_218 = (_Base_ptr)pVar2.first._M_node;
  local_210 = pVar2.second;
  local_228[1] = 0x11;
  local_228[0] = 1;
  std::pair<const_mahjong::Pattern,_int>::pair<mahjong::Pattern,_int,_true>
            (&local_220,(Pattern *)(local_228 + 1),local_228);
  pVar2 = std::
          map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
          ::insert(&this->factor_table,&local_220);
  local_238 = (_Base_ptr)pVar2.first._M_node;
  local_230 = pVar2.second;
  local_248[1] = 0x16;
  local_248[0] = 1;
  std::pair<const_mahjong::Pattern,_int>::pair<mahjong::Pattern,_int,_true>
            (&local_240,(Pattern *)(local_248 + 1),local_248);
  pVar2 = std::
          map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
          ::insert(&this->factor_table,&local_240);
  local_258 = (_Base_ptr)pVar2.first._M_node;
  local_250 = pVar2.second;
  local_268[1] = 0x17;
  local_268[0] = local_24 + 1;
  std::pair<const_mahjong::Pattern,_int>::pair<mahjong::Pattern,_int,_true>
            (&local_260,(Pattern *)(local_268 + 1),local_268);
  pVar2 = std::
          map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
          ::insert(&this->factor_table,&local_260);
  local_278 = (_Base_ptr)pVar2.first._M_node;
  local_270 = pVar2.second;
  local_288[1] = 0x18;
  local_288[0] = local_24 + 1;
  std::pair<const_mahjong::Pattern,_int>::pair<mahjong::Pattern,_int,_true>
            (&local_280,(Pattern *)(local_288 + 1),local_288);
  pVar2 = std::
          map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
          ::insert(&this->factor_table,&local_280);
  local_298 = (_Base_ptr)pVar2.first._M_node;
  local_290 = pVar2.second;
  local_2a8[1] = 0x19;
  local_2a8[0] = local_24 + 1;
  std::pair<const_mahjong::Pattern,_int>::pair<mahjong::Pattern,_int,_true>
            (&local_2a0,(Pattern *)(local_2a8 + 1),local_2a8);
  pVar2 = std::
          map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
          ::insert(&this->factor_table,&local_2a0);
  local_2b8 = (_Base_ptr)pVar2.first._M_node;
  local_2b0 = pVar2.second;
  local_2c8[1] = 0x12;
  local_2c8[0] = 2;
  std::pair<const_mahjong::Pattern,_int>::pair<mahjong::Pattern,_int,_true>
            (&local_2c0,(Pattern *)(local_2c8 + 1),local_2c8);
  pVar2 = std::
          map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
          ::insert(&this->factor_table,&local_2c0);
  local_2d8 = (_Base_ptr)pVar2.first._M_node;
  local_2d0 = pVar2.second;
  local_2e8[1] = 0x13;
  local_2e8[0] = 2;
  std::pair<const_mahjong::Pattern,_int>::pair<mahjong::Pattern,_int,_true>
            (&local_2e0,(Pattern *)(local_2e8 + 1),local_2e8);
  pVar2 = std::
          map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
          ::insert(&this->factor_table,&local_2e0);
  local_2f8 = (_Base_ptr)pVar2.first._M_node;
  local_2f0 = pVar2.second;
  local_308[1] = 0x14;
  local_308[0] = 2;
  std::pair<const_mahjong::Pattern,_int>::pair<mahjong::Pattern,_int,_true>
            (&local_300,(Pattern *)(local_308 + 1),local_308);
  pVar2 = std::
          map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
          ::insert(&this->factor_table,&local_300);
  local_318 = (_Base_ptr)pVar2.first._M_node;
  local_310 = pVar2.second;
  local_328[1] = 0x15;
  local_328[0] = 2;
  std::pair<const_mahjong::Pattern,_int>::pair<mahjong::Pattern,_int,_true>
            (&local_320,(Pattern *)(local_328 + 1),local_328);
  pVar2 = std::
          map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
          ::insert(&this->factor_table,&local_320);
  local_338 = (_Base_ptr)pVar2.first._M_node;
  local_330 = pVar2.second;
  local_348[1] = 2;
  local_348[0] = 2;
  std::pair<const_mahjong::Pattern,_int>::pair<mahjong::Pattern,_int,_true>
            (&local_340,(Pattern *)(local_348 + 1),local_348);
  pVar2 = std::
          map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
          ::insert(&this->factor_table,&local_340);
  local_358 = (_Base_ptr)pVar2.first._M_node;
  local_350 = pVar2.second;
  local_368[1] = 0x1a;
  local_368[0] = 2;
  std::pair<const_mahjong::Pattern,_int>::pair<mahjong::Pattern,_int,_true>
            (&local_360,(Pattern *)(local_368 + 1),local_368);
  pVar2 = std::
          map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
          ::insert(&this->factor_table,&local_360);
  local_378 = (_Base_ptr)pVar2.first._M_node;
  local_370 = pVar2.second;
  local_388[1] = 0x1b;
  local_388[0] = 2;
  std::pair<const_mahjong::Pattern,_int>::pair<mahjong::Pattern,_int,_true>
            (&local_380,(Pattern *)(local_388 + 1),local_388);
  pVar2 = std::
          map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
          ::insert(&this->factor_table,&local_380);
  local_398 = (_Base_ptr)pVar2.first._M_node;
  local_390 = pVar2.second;
  local_3a8[1] = 0x1c;
  local_3a8[0] = 2;
  std::pair<const_mahjong::Pattern,_int>::pair<mahjong::Pattern,_int,_true>
            (&local_3a0,(Pattern *)(local_3a8 + 1),local_3a8);
  pVar2 = std::
          map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
          ::insert(&this->factor_table,&local_3a0);
  local_3b8 = (_Base_ptr)pVar2.first._M_node;
  local_3b0 = pVar2.second;
  local_3c8[1] = 0x1d;
  local_3c8[0] = 2;
  std::pair<const_mahjong::Pattern,_int>::pair<mahjong::Pattern,_int,_true>
            (&local_3c0,(Pattern *)(local_3c8 + 1),local_3c8);
  pVar2 = std::
          map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
          ::insert(&this->factor_table,&local_3c0);
  local_3d8 = (_Base_ptr)pVar2.first._M_node;
  local_3d0 = pVar2.second;
  local_3e8[1] = 0x1e;
  local_3e8[0] = 2;
  std::pair<const_mahjong::Pattern,_int>::pair<mahjong::Pattern,_int,_true>
            (&local_3e0,(Pattern *)(local_3e8 + 1),local_3e8);
  pVar2 = std::
          map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
          ::insert(&this->factor_table,&local_3e0);
  local_3f8 = (_Base_ptr)pVar2.first._M_node;
  local_3f0 = pVar2.second;
  local_408[1] = 0x1f;
  local_408[0] = 2;
  std::pair<const_mahjong::Pattern,_int>::pair<mahjong::Pattern,_int,_true>
            (&local_400,(Pattern *)(local_408 + 1),local_408);
  pVar2 = std::
          map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
          ::insert(&this->factor_table,&local_400);
  local_418 = (_Base_ptr)pVar2.first._M_node;
  local_410 = pVar2.second;
  local_428[1] = 0x20;
  local_428[0] = 2;
  std::pair<const_mahjong::Pattern,_int>::pair<mahjong::Pattern,_int,_true>
            (&local_420,(Pattern *)(local_428 + 1),local_428);
  pVar2 = std::
          map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
          ::insert(&this->factor_table,&local_420);
  local_438 = (_Base_ptr)pVar2.first._M_node;
  local_430 = pVar2.second;
  local_448[1] = 0x21;
  local_448[0] = local_24 + 2;
  std::pair<const_mahjong::Pattern,_int>::pair<mahjong::Pattern,_int,_true>
            (&local_440,(Pattern *)(local_448 + 1),local_448);
  pVar2 = std::
          map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
          ::insert(&this->factor_table,&local_440);
  local_458 = (_Base_ptr)pVar2.first._M_node;
  local_450 = pVar2.second;
  local_468[1] = 0x23;
  local_468[0] = local_24 + 2;
  std::pair<const_mahjong::Pattern,_int>::pair<mahjong::Pattern,_int,_true>
            (&local_460,(Pattern *)(local_468 + 1),local_468);
  pVar2 = std::
          map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
          ::insert(&this->factor_table,&local_460);
  local_478 = (_Base_ptr)pVar2.first._M_node;
  local_470 = pVar2.second;
  local_488[1] = 0x22;
  local_488[0] = 3;
  std::pair<const_mahjong::Pattern,_int>::pair<mahjong::Pattern,_int,_true>
            (&local_480,(Pattern *)(local_488 + 1),local_488);
  pVar2 = std::
          map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
          ::insert(&this->factor_table,&local_480);
  local_498 = (_Base_ptr)pVar2.first._M_node;
  local_490 = pVar2.second;
  local_4a8[1] = 0x24;
  local_4a8[0] = 6;
  std::pair<const_mahjong::Pattern,_int>::pair<mahjong::Pattern,_int,_true>
            (&local_4a0,(Pattern *)(local_4a8 + 1),local_4a8);
  pVar2 = std::
          map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
          ::insert(&this->factor_table,&local_4a0);
  local_4b8 = (_Base_ptr)pVar2.first._M_node;
  local_4b0 = pVar2.second;
  local_4c4 = HeavenlyHand;
  std::pair<const_mahjong::Pattern,_int>::pair<mahjong::Pattern,_true>
            (&local_4c0,&local_4c4,&LIMIT_HAND_FACTOR);
  pVar2 = std::
          map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
          ::insert(&this->factor_table,&local_4c0);
  local_4d8 = (_Base_ptr)pVar2.first._M_node;
  local_4d0 = pVar2.second;
  local_4e4 = EarthlyHand;
  std::pair<const_mahjong::Pattern,_int>::pair<mahjong::Pattern,_true>
            (&local_4e0,&local_4e4,&LIMIT_HAND_FACTOR);
  pVar2 = std::
          map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
          ::insert(&this->factor_table,&local_4e0);
  local_4f8 = (_Base_ptr)pVar2.first._M_node;
  local_4f0 = pVar2.second;
  local_504 = FourClosedTriplets;
  std::pair<const_mahjong::Pattern,_int>::pair<mahjong::Pattern,_true>
            (&local_500,&local_504,&LIMIT_HAND_FACTOR);
  pVar2 = std::
          map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
          ::insert(&this->factor_table,&local_500);
  local_518 = (_Base_ptr)pVar2.first._M_node;
  local_510 = pVar2.second;
  local_524 = ThirteenOrphans;
  std::pair<const_mahjong::Pattern,_int>::pair<mahjong::Pattern,_true>
            (&local_520,&local_524,&LIMIT_HAND_FACTOR);
  pVar2 = std::
          map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
          ::insert(&this->factor_table,&local_520);
  local_538 = (_Base_ptr)pVar2.first._M_node;
  local_530 = pVar2.second;
  local_544 = NineGates;
  std::pair<const_mahjong::Pattern,_int>::pair<mahjong::Pattern,_true>
            (&local_540,&local_544,&LIMIT_HAND_FACTOR);
  pVar2 = std::
          map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
          ::insert(&this->factor_table,&local_540);
  local_558 = (_Base_ptr)pVar2.first._M_node;
  local_550 = pVar2.second;
  local_564 = AllGreen;
  std::pair<const_mahjong::Pattern,_int>::pair<mahjong::Pattern,_true>
            (&local_560,&local_564,&LIMIT_HAND_FACTOR);
  pVar2 = std::
          map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
          ::insert(&this->factor_table,&local_560);
  local_578 = (_Base_ptr)pVar2.first._M_node;
  local_570 = pVar2.second;
  local_584 = AllHonors;
  std::pair<const_mahjong::Pattern,_int>::pair<mahjong::Pattern,_true>
            (&local_580,&local_584,&LIMIT_HAND_FACTOR);
  pVar2 = std::
          map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
          ::insert(&this->factor_table,&local_580);
  local_598 = (_Base_ptr)pVar2.first._M_node;
  local_590 = pVar2.second;
  local_5a4 = AllTerminals;
  std::pair<const_mahjong::Pattern,_int>::pair<mahjong::Pattern,_true>
            (&local_5a0,&local_5a4,&LIMIT_HAND_FACTOR);
  pVar2 = std::
          map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
          ::insert(&this->factor_table,&local_5a0);
  local_5b8 = (_Base_ptr)pVar2.first._M_node;
  local_5b0 = pVar2.second;
  local_5c4 = BigThreeDragons;
  std::pair<const_mahjong::Pattern,_int>::pair<mahjong::Pattern,_true>
            (&local_5c0,&local_5c4,&LIMIT_HAND_FACTOR);
  pVar2 = std::
          map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
          ::insert(&this->factor_table,&local_5c0);
  local_5d8 = (_Base_ptr)pVar2.first._M_node;
  local_5d0 = pVar2.second;
  local_5e4 = LittleFourWinds;
  std::pair<const_mahjong::Pattern,_int>::pair<mahjong::Pattern,_true>
            (&local_5e0,&local_5e4,&LIMIT_HAND_FACTOR);
  pVar2 = std::
          map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
          ::insert(&this->factor_table,&local_5e0);
  local_5f8 = (_Base_ptr)pVar2.first._M_node;
  local_5f0 = pVar2.second;
  local_604 = BigFourWinds;
  std::pair<const_mahjong::Pattern,_int>::pair<mahjong::Pattern,_true>
            (&local_600,&local_604,&LIMIT_HAND_FACTOR);
  pVar2 = std::
          map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
          ::insert(&this->factor_table,&local_600);
  local_618 = (_Base_ptr)pVar2.first._M_node;
  local_610 = pVar2.second;
  local_624 = FourQuads;
  std::pair<const_mahjong::Pattern,_int>::pair<mahjong::Pattern,_true>
            (&local_620,&local_624,&LIMIT_HAND_FACTOR);
  std::
  map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
  ::insert(&this->factor_table,&local_620);
  return;
}

Assistant:

DoublingFactorTable::DoublingFactorTable(const PlayerHand& hand, const WiningState& state)
	: hand(hand)
	, state(state)
{
	auto closed_hand_bonus = 0;
	if (hand.isClosedHand())
	{
		closed_hand_bonus = 1;
	}

	factor_table.insert({ Pattern::ReadyHand, 1 });
	factor_table.insert({ Pattern::OneShot, 1 });
	factor_table.insert({ Pattern::LastTileFromTheWall, 1 });
	factor_table.insert({ Pattern::LastDiscard, 1 });
	factor_table.insert({ Pattern::DeadWallDraw, 1 });
	factor_table.insert({ Pattern::RobbingQuad, 1 });
	factor_table.insert({ Pattern::SelfDrawn, 1 });
	factor_table.insert({ Pattern::OneSetOfIdenticalSequences, 1 });
	factor_table.insert({ Pattern::NoPointsHand, 1 });
	factor_table.insert({ Pattern::WhiteDragon, 1 });
	factor_table.insert({ Pattern::GreenDragon, 1 });
	factor_table.insert({ Pattern::RedDragon, 1 });
	factor_table.insert({ Pattern::EastWind, 1 });
	factor_table.insert({ Pattern::SouthWind, 1 });
	factor_table.insert({ Pattern::WestWind, 1 });
	factor_table.insert({ Pattern::NorthWind, 1 });
	factor_table.insert({ Pattern::AllSimples, 1 });

	factor_table.insert({ Pattern::ThreeColourStraights, 1 + closed_hand_bonus });
	factor_table.insert({ Pattern::Straight, 1 + closed_hand_bonus });
	factor_table.insert({ Pattern::TerminalOrHonorInEachSet, 1 + closed_hand_bonus });

	factor_table.insert({ Pattern::DoubleEastWind, 2 });
	factor_table.insert({ Pattern::DoubleSouthWind, 2 });
	factor_table.insert({ Pattern::DoubleWestWind, 2 });
	factor_table.insert({ Pattern::DoubleNorthWind, 2 });
	factor_table.insert({ Pattern::DoubleReady, 2 });
	factor_table.insert({ Pattern::SevenPairs, 2 });
	factor_table.insert({ Pattern::AllTriplets, 2 });
	factor_table.insert({ Pattern::ThreeClosedTriplets, 2 });
	factor_table.insert({ Pattern::ThreeColourTriplets, 2 });
	factor_table.insert({ Pattern::ThreeQuads, 2 });
	factor_table.insert({ Pattern::LittleThreeDragons, 2 });
	factor_table.insert({ Pattern::AllTerminalsAndHornors, 2 });

	factor_table.insert({ Pattern::HalfFlush, 2 + closed_hand_bonus });
	factor_table.insert({ Pattern::TerminalInEachSet, 2 + closed_hand_bonus });

	factor_table.insert({ Pattern::TwoSetsOfIdenticalSequences, 3 });

	factor_table.insert({ Pattern::Flush, 6 });

	factor_table.insert({ Pattern::HeavenlyHand, LIMIT_HAND_FACTOR });
	factor_table.insert({ Pattern::EarthlyHand, LIMIT_HAND_FACTOR });
	factor_table.insert({ Pattern::FourClosedTriplets, LIMIT_HAND_FACTOR });
	factor_table.insert({ Pattern::ThirteenOrphans, LIMIT_HAND_FACTOR });
	factor_table.insert({ Pattern::NineGates, LIMIT_HAND_FACTOR });
	factor_table.insert({ Pattern::AllGreen, LIMIT_HAND_FACTOR });
	factor_table.insert({ Pattern::AllHonors, LIMIT_HAND_FACTOR });
	factor_table.insert({ Pattern::AllTerminals, LIMIT_HAND_FACTOR });
	factor_table.insert({ Pattern::BigThreeDragons, LIMIT_HAND_FACTOR });
	factor_table.insert({ Pattern::LittleFourWinds, LIMIT_HAND_FACTOR });
	factor_table.insert({ Pattern::BigFourWinds, LIMIT_HAND_FACTOR });
	factor_table.insert({ Pattern::FourQuads, LIMIT_HAND_FACTOR });
}